

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_prespch_buf.c
# Opt level: O0

int fe_prespch_read_cep(prespch_buf_t *prespch_buf,mfcc_t *feat)

{
  bool bVar1;
  mfcc_t *feat_local;
  prespch_buf_t *prespch_buf_local;
  
  bVar1 = prespch_buf->ncep != 0;
  if (bVar1) {
    memcpy(feat,prespch_buf->cep_buf[prespch_buf->cep_read_ptr],(long)prespch_buf->num_cepstra << 2)
    ;
    prespch_buf->cep_read_ptr =
         (int16)((prespch_buf->cep_read_ptr + 1) % (int)prespch_buf->num_frames_cep);
    prespch_buf->ncep = prespch_buf->ncep + -1;
  }
  prespch_buf_local._4_4_ = (uint)bVar1;
  return prespch_buf_local._4_4_;
}

Assistant:

int
fe_prespch_read_cep(prespch_buf_t * prespch_buf, mfcc_t * feat)
{
    if (prespch_buf->ncep == 0)
        return 0;
    memcpy(feat, prespch_buf->cep_buf[prespch_buf->cep_read_ptr],
           sizeof(mfcc_t) * prespch_buf->num_cepstra);
    prespch_buf->cep_read_ptr = (prespch_buf->cep_read_ptr + 1) % prespch_buf->num_frames_cep;
    prespch_buf->ncep--;
    return 1;
}